

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_pstream.c
# Opt level: O3

HTS_Boolean
HTS_PStreamSet_create
          (HTS_PStreamSet *pss,HTS_SStreamSet *sss,double *msd_threshold,double *gv_weight)

{
  double dVar1;
  double dVar2;
  int iVar3;
  double *pdVar4;
  double **ppdVar5;
  double *pdVar6;
  HTS_Boolean HVar7;
  int iVar8;
  size_t sVar9;
  HTS_PStream *pHVar10;
  size_t sVar11;
  size_t sVar12;
  HTS_Boolean *pHVar13;
  double **ppdVar14;
  double *pdVar15;
  int *piVar16;
  double *pdVar17;
  bool bVar18;
  size_t sVar19;
  long lVar20;
  ulong uVar21;
  int iVar22;
  undefined8 *puVar23;
  ulong uVar24;
  ulong uVar25;
  double **ppdVar26;
  ulong uVar27;
  double **ppdVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  bool bVar35;
  double dVar36;
  double dVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined8 uVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double vari;
  double mean;
  long local_c8;
  ulong local_b8;
  double local_90;
  double local_88;
  double *local_80;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  undefined8 uStack_60;
  double *local_50;
  double local_48;
  double dStack_40;
  
  if (pss->nstream == 0) {
    sVar9 = HTS_SStreamSet_get_nstream(sss);
    pss->nstream = sVar9;
    pHVar10 = (HTS_PStream *)HTS_calloc(sVar9,0x90);
    pss->pstream = pHVar10;
    sVar9 = HTS_SStreamSet_get_total_frame(sss);
    pss->total_frame = sVar9;
    if (pss->nstream != 0) {
      sVar9 = 0;
      local_80 = msd_threshold;
      local_50 = gv_weight;
      do {
        pdVar15 = local_80;
        pHVar10 = pss->pstream + sVar9;
        HVar7 = HTS_SStreamSet_is_msd(sss,sVar9);
        if (HVar7 == '\x01') {
          pHVar10->length = 0;
          sVar11 = HTS_SStreamSet_get_total_state(sss);
          if (sVar11 != 0) {
            sVar11 = 0;
            do {
              dVar36 = HTS_SStreamSet_get_msd(sss,sVar9,sVar11);
              if (pdVar15[sVar9] <= dVar36 && dVar36 != pdVar15[sVar9]) {
                sVar12 = HTS_SStreamSet_get_duration(sss,sVar11);
                pHVar10->length = pHVar10->length + sVar12;
              }
              sVar11 = sVar11 + 1;
              sVar12 = HTS_SStreamSet_get_total_state(sss);
            } while (sVar11 < sVar12);
          }
          pHVar13 = (HTS_Boolean *)HTS_calloc(pss->total_frame,1);
          pHVar10->msd_flag = pHVar13;
          sVar11 = HTS_SStreamSet_get_total_state(sss);
          if (sVar11 != 0) {
            sVar11 = 0;
            lVar20 = 0;
            do {
              dVar37 = HTS_SStreamSet_get_msd(sss,sVar9,sVar11);
              dVar36 = local_80[sVar9];
              sVar12 = HTS_SStreamSet_get_duration(sss,sVar11);
              if (dVar37 <= dVar36) {
                if (sVar12 != 0) {
                  uVar31 = 0;
                  do {
                    pHVar10->msd_flag[lVar20] = '\0';
                    lVar20 = lVar20 + 1;
                    uVar31 = uVar31 + 1;
                    sVar12 = HTS_SStreamSet_get_duration(sss,sVar11);
                  } while (uVar31 < sVar12);
                }
              }
              else if (sVar12 != 0) {
                uVar31 = 0;
                do {
                  pHVar10->msd_flag[lVar20] = '\x01';
                  lVar20 = lVar20 + 1;
                  uVar31 = uVar31 + 1;
                  sVar12 = HTS_SStreamSet_get_duration(sss,sVar11);
                } while (uVar31 < sVar12);
              }
              sVar11 = sVar11 + 1;
              sVar12 = HTS_SStreamSet_get_total_state(sss);
            } while (sVar11 < sVar12);
          }
        }
        else {
          pHVar10->length = pss->total_frame;
          pHVar10->msd_flag = (HTS_Boolean *)0x0;
        }
        sVar11 = HTS_SStreamSet_get_vector_length(sss,sVar9);
        pHVar10->vector_length = sVar11;
        sVar11 = HTS_SStreamSet_get_window_max_width(sss,sVar9);
        pHVar10->width = sVar11 * 2 + 1;
        sVar11 = HTS_SStreamSet_get_window_size(sss,sVar9);
        pHVar10->win_size = sVar11;
        if (pHVar10->length != 0) {
          ppdVar14 = HTS_alloc_matrix(pHVar10->length,pHVar10->vector_length * sVar11);
          (pHVar10->sm).mean = ppdVar14;
          ppdVar14 = HTS_alloc_matrix(pHVar10->length,pHVar10->win_size * pHVar10->vector_length);
          (pHVar10->sm).ivar = ppdVar14;
          pdVar15 = (double *)HTS_calloc(pHVar10->length,8);
          (pHVar10->sm).wum = pdVar15;
          ppdVar14 = HTS_alloc_matrix(pHVar10->length,pHVar10->width);
          (pHVar10->sm).wuw = ppdVar14;
          pdVar15 = (double *)HTS_calloc(pHVar10->length,8);
          (pHVar10->sm).g = pdVar15;
          ppdVar14 = HTS_alloc_matrix(pHVar10->length,pHVar10->vector_length);
          pHVar10->par = ppdVar14;
          sVar11 = pHVar10->win_size;
        }
        piVar16 = (int *)HTS_calloc(sVar11,4);
        pHVar10->win_l_width = piVar16;
        piVar16 = (int *)HTS_calloc(pHVar10->win_size,4);
        pHVar10->win_r_width = piVar16;
        ppdVar14 = (double **)HTS_calloc(pHVar10->win_size,8);
        pHVar10->win_coefficient = ppdVar14;
        if (pHVar10->win_size != 0) {
          sVar11 = 0;
          do {
            iVar8 = HTS_SStreamSet_get_window_left_width(sss,sVar9,sVar11);
            pHVar10->win_l_width[sVar11] = iVar8;
            iVar8 = HTS_SStreamSet_get_window_right_width(sss,sVar9,sVar11);
            pHVar10->win_r_width[sVar11] = iVar8;
            pdVar15 = (double *)
                      HTS_calloc((long)(int)((uint)(iVar8 + pHVar10->win_l_width[sVar11] == 0) +
                                            pHVar10->win_l_width[sVar11] * -2),8);
            pHVar10->win_coefficient[sVar11] = pdVar15;
            pHVar10->win_coefficient[sVar11] =
                 pHVar10->win_coefficient[sVar11] + -(long)pHVar10->win_l_width[sVar11];
            iVar8 = pHVar10->win_l_width[sVar11];
            if (iVar8 <= pHVar10->win_r_width[sVar11]) {
              lVar20 = (long)iVar8 + -1;
              do {
                dVar36 = HTS_SStreamSet_get_window_coefficient(sss,sVar9,sVar11,iVar8);
                pHVar10->win_coefficient[sVar11][lVar20 + 1] = dVar36;
                lVar20 = lVar20 + 1;
                iVar8 = iVar8 + 1;
              } while (lVar20 < pHVar10->win_r_width[sVar11]);
            }
            sVar11 = sVar11 + 1;
          } while (sVar11 < pHVar10->win_size);
        }
        HVar7 = HTS_SStreamSet_use_gv(sss,sVar9);
        if (HVar7 == '\0') {
          pHVar10->gv_switch = (HTS_Boolean *)0x0;
          pHVar10->gv_length = 0;
          pHVar10->gv_mean = (double *)0x0;
          pHVar10->gv_vari = (double *)0x0;
        }
        else {
          pdVar15 = (double *)HTS_calloc(pHVar10->vector_length,8);
          pHVar10->gv_mean = pdVar15;
          pdVar17 = (double *)HTS_calloc(pHVar10->vector_length,8);
          pdVar15 = local_50;
          pHVar10->gv_vari = pdVar17;
          if (pHVar10->vector_length != 0) {
            sVar11 = 0;
            do {
              dVar36 = HTS_SStreamSet_get_gv_mean(sss,sVar9,sVar11);
              pHVar10->gv_mean[sVar11] = dVar36 * pdVar15[sVar9];
              dVar36 = HTS_SStreamSet_get_gv_vari(sss,sVar9,sVar11);
              pHVar10->gv_vari[sVar11] = dVar36;
              sVar11 = sVar11 + 1;
            } while (sVar11 < pHVar10->vector_length);
          }
          pHVar13 = (HTS_Boolean *)HTS_calloc(pHVar10->length,1);
          pHVar10->gv_switch = pHVar13;
          HVar7 = HTS_SStreamSet_is_msd(sss,sVar9);
          sVar11 = HTS_SStreamSet_get_total_state(sss);
          if (HVar7 == '\x01') {
            if (sVar11 != 0) {
              sVar11 = 0;
              lVar33 = 0;
              lVar20 = 0;
              do {
                sVar12 = HTS_SStreamSet_get_duration(sss,sVar11);
                if (sVar12 != 0) {
                  uVar31 = 0;
                  do {
                    if (pHVar10->msd_flag[lVar20] == '\x01') {
                      HVar7 = HTS_SStreamSet_get_gv_switch(sss,sVar9,sVar11);
                      pHVar10->gv_switch[lVar33] = HVar7;
                      lVar33 = lVar33 + 1;
                    }
                    uVar31 = uVar31 + 1;
                    lVar20 = lVar20 + 1;
                    sVar12 = HTS_SStreamSet_get_duration(sss,sVar11);
                  } while (uVar31 < sVar12);
                }
                sVar11 = sVar11 + 1;
                sVar12 = HTS_SStreamSet_get_total_state(sss);
              } while (sVar11 < sVar12);
            }
          }
          else if (sVar11 != 0) {
            sVar11 = 0;
            lVar20 = 0;
            do {
              sVar12 = HTS_SStreamSet_get_duration(sss,sVar11);
              if (sVar12 != 0) {
                uVar31 = 0;
                do {
                  HVar7 = HTS_SStreamSet_get_gv_switch(sss,sVar9,sVar11);
                  pHVar10->gv_switch[lVar20] = HVar7;
                  lVar20 = lVar20 + 1;
                  uVar31 = uVar31 + 1;
                  sVar12 = HTS_SStreamSet_get_duration(sss,sVar11);
                } while (uVar31 < sVar12);
              }
              sVar11 = sVar11 + 1;
              sVar12 = HTS_SStreamSet_get_total_state(sss);
            } while (sVar11 < sVar12);
          }
          pHVar10->gv_length = 0;
          if (pHVar10->length != 0) {
            sVar11 = 0;
            sVar12 = 0;
            do {
              if (pHVar10->gv_switch[sVar12] != '\0') {
                sVar11 = sVar11 + 1;
                pHVar10->gv_length = sVar11;
              }
              sVar12 = sVar12 + 1;
            } while (pHVar10->length != sVar12);
          }
        }
        HVar7 = HTS_SStreamSet_is_msd(sss,sVar9);
        sVar11 = HTS_SStreamSet_get_total_state(sss);
        if (HVar7 == '\x01') {
          if (sVar11 != 0) {
            sVar11 = 0;
            local_b8 = 0;
            dVar36 = 0.0;
            do {
              sVar12 = HTS_SStreamSet_get_duration(sss,sVar11);
              if (sVar12 != 0) {
                uVar31 = 0;
                do {
                  if (pHVar10->msd_flag[(long)dVar36] == '\x01') {
                    uVar32 = pHVar10->win_size;
                    if (uVar32 != 0) {
                      local_68 = (double)(long)SUB84(dVar36,0);
                      uVar29 = 0;
                      local_78 = dVar36;
                      do {
                        iVar8 = pHVar10->win_l_width[uVar29];
                        lVar20 = (long)iVar8;
                        iVar3 = pHVar10->win_r_width[uVar29];
                        bVar18 = true;
                        if (iVar8 <= iVar3) {
                          iVar22 = iVar8 + SUB84(dVar36,0);
                          if (iVar22 < 0) {
                            bVar18 = false;
                          }
                          else {
                            iVar8 = iVar3 - iVar8;
                            bVar18 = false;
                            while ((lVar20 < (long)(int)pss->total_frame - (long)local_68 &&
                                   (pHVar10->msd_flag[lVar20 + (long)dVar36] == '\x01'))) {
                              bVar18 = iVar3 <= lVar20;
                              bVar35 = iVar8 == 0;
                              iVar8 = iVar8 + -1;
                              if ((bVar35) || (lVar20 = lVar20 + 1, iVar22 < 0)) break;
                            }
                          }
                        }
                        uVar24 = pHVar10->vector_length;
                        if (uVar24 != 0) {
                          uVar32 = 0;
                          do {
                            sVar12 = uVar24 * uVar29 + uVar32;
                            dVar36 = HTS_SStreamSet_get_mean(sss,sVar9,sVar11,sVar12);
                            (pHVar10->sm).mean[local_b8][sVar12] = dVar36;
                            dVar36 = 0.0;
                            if (uVar29 == 0 || bVar18) {
                              dVar37 = HTS_SStreamSet_get_vari(sss,sVar9,sVar11,sVar12);
                              dVar36 = 0.0;
                              if (((ABS(dVar37) < 1e+19) &&
                                  ((1e-19 < dVar37 || (dVar36 = 1e+38, dVar37 < 0.0)))) &&
                                 ((dVar37 < -1e-19 || (dVar36 = -1e+38, 0.0 <= dVar37)))) {
                                dVar36 = 1.0 / dVar37;
                              }
                            }
                            (pHVar10->sm).ivar[local_b8][sVar12] = dVar36;
                            uVar32 = uVar32 + 1;
                            uVar24 = pHVar10->vector_length;
                          } while (uVar32 < uVar24);
                          uVar32 = pHVar10->win_size;
                          dVar36 = local_78;
                        }
                        uVar29 = uVar29 + 1;
                      } while (uVar29 < uVar32);
                    }
                    local_b8 = local_b8 + 1;
                  }
                  dVar36 = (double)((long)dVar36 + 1);
                  uVar31 = uVar31 + 1;
                  sVar12 = HTS_SStreamSet_get_duration(sss,sVar11);
                } while (uVar31 < sVar12);
              }
              sVar11 = sVar11 + 1;
              sVar12 = HTS_SStreamSet_get_total_state(sss);
            } while (sVar11 < sVar12);
          }
        }
        else if (sVar11 != 0) {
          sVar11 = 0;
          local_c8 = 0;
          do {
            sVar12 = HTS_SStreamSet_get_duration(sss,sVar11);
            if (sVar12 != 0) {
              local_b8 = 0;
              do {
                uVar31 = pHVar10->win_size;
                if (uVar31 != 0) {
                  uVar32 = 0;
                  do {
                    iVar8 = pHVar10->win_l_width[uVar32];
                    iVar3 = pHVar10->win_r_width[uVar32];
                    bVar18 = true;
                    if (iVar8 <= iVar3) {
                      iVar22 = iVar8 + (int)local_c8;
                      if (iVar22 < 0) {
                        bVar18 = false;
                      }
                      else {
                        bVar18 = false;
                        do {
                          if (((int)pss->total_frame <= (int)local_c8 + iVar8) ||
                             (bVar18 = iVar3 <= iVar8, iVar8 == iVar3)) break;
                          iVar8 = iVar8 + 1;
                        } while (-1 < iVar22);
                      }
                    }
                    uVar29 = pHVar10->vector_length;
                    if (uVar29 != 0) {
                      uVar31 = 0;
                      do {
                        sVar12 = uVar29 * uVar32 + uVar31;
                        dVar36 = HTS_SStreamSet_get_mean(sss,sVar9,sVar11,sVar12);
                        (pHVar10->sm).mean[local_c8][sVar12] = dVar36;
                        dVar36 = 0.0;
                        if (uVar32 == 0 || bVar18) {
                          dVar37 = HTS_SStreamSet_get_vari(sss,sVar9,sVar11,sVar12);
                          dVar36 = 0.0;
                          if (((ABS(dVar37) < 1e+19) &&
                              ((1e-19 < dVar37 || (dVar36 = 1e+38, dVar37 < 0.0)))) &&
                             ((dVar37 < -1e-19 || (dVar36 = -1e+38, 0.0 <= dVar37)))) {
                            dVar36 = 1.0 / dVar37;
                          }
                        }
                        (pHVar10->sm).ivar[local_c8][sVar12] = dVar36;
                        uVar31 = uVar31 + 1;
                        uVar29 = pHVar10->vector_length;
                      } while (uVar31 < uVar29);
                      uVar31 = pHVar10->win_size;
                    }
                    uVar32 = uVar32 + 1;
                  } while (uVar32 < uVar31);
                }
                local_c8 = local_c8 + 1;
                local_b8 = local_b8 + 1;
                sVar12 = HTS_SStreamSet_get_duration(sss,sVar11);
              } while (local_b8 < sVar12);
            }
            sVar11 = sVar11 + 1;
            sVar12 = HTS_SStreamSet_get_total_state(sss);
          } while (sVar11 < sVar12);
        }
        if ((pHVar10->length != 0) && (pHVar10->vector_length != 0)) {
          sVar11 = 0;
          do {
            HTS_PStream_calc_wuw_and_wum(pHVar10,sVar11);
            uVar31 = pHVar10->length;
            if (uVar31 != 0) {
              uVar32 = pHVar10->width;
              lVar20 = -8;
              uVar29 = 0;
              do {
                if (uVar29 != 0 && 1 < uVar32) {
                  ppdVar14 = (pHVar10->sm).wuw;
                  pdVar15 = ppdVar14[uVar29];
                  dVar36 = *pdVar15;
                  puVar23 = (undefined8 *)((long)ppdVar14 + lVar20);
                  uVar24 = 1;
                  do {
                    dVar37 = ((double *)*puVar23)[uVar24];
                    dVar36 = dVar36 - dVar37 * dVar37 * *(double *)*puVar23;
                    *pdVar15 = dVar36;
                    if (uVar29 <= uVar24) break;
                    uVar24 = uVar24 + 1;
                    puVar23 = puVar23 + -1;
                  } while (uVar24 < uVar32);
                }
                if (1 < uVar32) {
                  ppdVar14 = (pHVar10->sm).wuw;
                  pdVar15 = ppdVar14[uVar29];
                  uVar25 = 2;
                  uVar24 = 1;
                  do {
                    uVar27 = uVar24 + 1;
                    dVar36 = pdVar15[uVar24];
                    if ((uVar29 != 0) && (uVar27 < uVar32)) {
                      uVar21 = 1;
                      puVar23 = (undefined8 *)((long)ppdVar14 + lVar20);
                      uVar34 = uVar25;
                      do {
                        pdVar17 = (double *)*puVar23;
                        dVar36 = dVar36 - pdVar17[uVar34] * pdVar17[uVar21] * *pdVar17;
                        pdVar15[uVar24] = dVar36;
                        if (uVar29 <= uVar21) break;
                        uVar21 = uVar21 + 1;
                        uVar34 = uVar34 + 1;
                        puVar23 = puVar23 + -1;
                      } while (uVar34 < uVar32);
                    }
                    pdVar15[uVar24] = dVar36 / *pdVar15;
                    uVar25 = uVar25 + 1;
                    uVar24 = uVar27;
                  } while (uVar27 != uVar32);
                }
                uVar29 = uVar29 + 1;
                lVar20 = lVar20 + 8;
              } while (uVar29 != uVar31);
              pdVar17 = (pHVar10->sm).g;
              pdVar4 = (pHVar10->sm).wum;
              pdVar15 = pdVar17 + -1;
              lVar20 = -8;
              uVar29 = 0;
              do {
                dVar36 = pdVar4[uVar29];
                pdVar17[uVar29] = dVar36;
                if (uVar29 != 0 && 1 < uVar32) {
                  ppdVar14 = (pHVar10->sm).wuw;
                  uVar24 = 1;
                  lVar33 = 0;
                  do {
                    dVar36 = dVar36 - *(double *)
                                       (*(long *)((long)ppdVar14 + lVar33 + lVar20) + uVar24 * 8) *
                                      *(double *)((long)pdVar15 + lVar33);
                    pdVar17[uVar29] = dVar36;
                    if (uVar29 <= uVar24) break;
                    uVar24 = uVar24 + 1;
                    lVar33 = lVar33 + -8;
                  } while (uVar24 < uVar32);
                }
                uVar29 = uVar29 + 1;
                pdVar15 = pdVar15 + 1;
                lVar20 = lVar20 + 8;
              } while (uVar29 != uVar31);
              ppdVar5 = pHVar10->par;
              ppdVar26 = (pHVar10->sm).wuw;
              ppdVar14 = ppdVar5 + uVar31;
              uVar24 = 0;
              uVar29 = uVar31;
              do {
                lVar20 = ~uVar24 + uVar31;
                pdVar15 = ppdVar26[lVar20];
                dVar36 = pdVar17[lVar20] / *pdVar15;
                pdVar4 = ppdVar5[lVar20];
                pdVar4[sVar11] = dVar36;
                if (1 < uVar32) {
                  lVar20 = 0;
                  do {
                    if (uVar31 <= uVar29 + lVar20) break;
                    dVar36 = dVar36 - pdVar15[lVar20 + 1] * ppdVar14[lVar20][sVar11];
                    pdVar4[sVar11] = dVar36;
                    lVar20 = lVar20 + 1;
                  } while (uVar32 - 1 != lVar20);
                }
                uVar24 = uVar24 + 1;
                ppdVar14 = ppdVar14 + -1;
                uVar29 = uVar29 - 1;
              } while (uVar24 != uVar31);
            }
            if (pHVar10->gv_length != 0) {
              HTS_PStream_calc_gv(pHVar10,sVar11,&local_88,&local_90);
              dVar36 = pHVar10->gv_mean[sVar11] / local_90;
              if (dVar36 < 0.0) {
                dVar36 = sqrt(dVar36);
              }
              else {
                dVar36 = SQRT(dVar36);
              }
              sVar12 = pHVar10->length;
              if (sVar12 != 0) {
                pHVar13 = pHVar10->gv_switch;
                sVar19 = 0;
                do {
                  if (pHVar13[sVar19] != '\0') {
                    pHVar10->par[sVar19][sVar11] =
                         (pHVar10->par[sVar19][sVar11] - local_88) * dVar36 + local_88;
                  }
                  sVar19 = sVar19 + 1;
                } while (sVar12 != sVar19);
              }
              HTS_PStream_calc_wuw_and_wum(pHVar10,sVar11);
              uVar31 = pHVar10->length;
              lVar20 = pHVar10->win_size * uVar31;
              auVar38._8_4_ = (int)((ulong)lVar20 >> 0x20);
              auVar38._0_8_ = lVar20;
              auVar38._12_4_ = 0x45300000;
              dVar46 = 1.0 / ((auVar38._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)lVar20) - 4503599627370496.0));
              auVar39._8_4_ = (int)(uVar31 >> 0x20);
              auVar39._0_8_ = uVar31;
              auVar39._12_4_ = 0x45300000;
              dStack_40 = auVar39._8_8_ - 1.9342813113834067e+25;
              local_48 = dStack_40 + ((double)CONCAT44(0x43300000,(int)uVar31) - 4503599627370496.0)
              ;
              lVar33 = uVar31 * uVar31;
              auVar40._8_4_ = (int)((ulong)lVar33 >> 0x20);
              auVar40._0_8_ = lVar33;
              auVar40._12_4_ = 0x45300000;
              lVar20 = uVar31 - 1;
              auVar41._8_4_ = (int)((ulong)lVar20 >> 0x20);
              auVar41._0_8_ = lVar20;
              auVar41._12_4_ = 0x45300000;
              uVar32 = 1;
              dVar37 = 0.0;
              uVar42 = 0;
              dVar36 = 0.1;
              uStack_70 = 0;
              do {
                local_78 = dVar36;
                local_68 = dVar37;
                uStack_60 = uVar42;
                HTS_PStream_calc_gv(pHVar10,sVar11,&local_88,&local_90);
                pdVar15 = pHVar10->gv_mean;
                pdVar17 = pHVar10->gv_vari;
                dVar36 = pdVar17[sVar11];
                dVar37 = pdVar15[sVar11];
                dVar43 = 0.0;
                if (uVar31 != 0) {
                  ppdVar14 = (pHVar10->sm).wuw;
                  uVar29 = pHVar10->width;
                  ppdVar5 = pHVar10->par;
                  pdVar4 = (pHVar10->sm).g;
                  uVar24 = 0;
                  ppdVar26 = ppdVar14;
                  ppdVar28 = ppdVar5;
                  do {
                    pdVar6 = ppdVar14[uVar24];
                    dVar43 = *pdVar6 * ppdVar5[uVar24][sVar11];
                    pdVar4[uVar24] = dVar43;
                    if (1 < uVar29) {
                      uVar25 = 1;
                      lVar30 = -1;
                      do {
                        if (uVar24 + uVar25 < uVar31) {
                          dVar43 = dVar43 + pdVar6[uVar25] * ppdVar28[uVar25][sVar11];
                          pdVar4[uVar24] = dVar43;
                        }
                        if (uVar25 <= uVar24) {
                          dVar43 = dVar43 + ppdVar26[lVar30][uVar25] * ppdVar28[lVar30][sVar11];
                          pdVar4[uVar24] = dVar43;
                        }
                        uVar25 = uVar25 + 1;
                        lVar30 = lVar30 + -1;
                      } while (uVar29 != uVar25);
                    }
                    uVar24 = uVar24 + 1;
                    ppdVar28 = ppdVar28 + 1;
                    ppdVar26 = ppdVar26 + 1;
                  } while (uVar24 != uVar31);
                  pdVar6 = (pHVar10->sm).wum;
                  pHVar13 = pHVar10->gv_switch;
                  dVar43 = 0.0;
                  uVar29 = 0;
                  do {
                    dVar1 = pdVar6[uVar29];
                    dVar2 = pdVar17[sVar11];
                    dVar45 = ppdVar5[uVar29][sVar11] - local_88;
                    dVar44 = (dVar1 - pdVar4[uVar29]) * dVar46;
                    if (pHVar13[uVar29] != '\0') {
                      dVar44 = dVar44 + ((dVar36 * -2.0 * (local_90 - dVar37)) / local_48) * dVar45;
                    }
                    dVar43 = dVar43 + (pdVar4[uVar29] * -0.5 + dVar1) *
                                      ppdVar5[uVar29][sVar11] * dVar46;
                    pdVar4[uVar29] =
                         (1.0 / (*ppdVar14[uVar29] * -dVar46 +
                                ((dVar2 + dVar2) * dVar45 * dVar45 +
                                dVar2 * ((auVar41._8_8_ - 1.9342813113834067e+25) +
                                        ((double)CONCAT44(0x43300000,(int)lVar20) -
                                        4503599627370496.0)) * (local_90 - pdVar15[sVar11])) *
                                (-2.0 / ((auVar40._8_8_ - 1.9342813113834067e+25) +
                                        ((double)CONCAT44(0x43300000,(int)lVar33) -
                                        4503599627370496.0))))) * dVar44;
                    uVar29 = uVar29 + 1;
                  } while (uVar31 != uVar29);
                }
                uVar42 = 0x8000000000000000;
                dVar37 = -((local_90 - (dVar37 + dVar37)) * local_90 * -0.5 * dVar36 + dVar43);
                dVar36 = local_78;
                if ((1 < uVar32) &&
                   (dVar36 = (double)(~-(ulong)(local_68 < dVar37) & (ulong)local_78 |
                                     (ulong)(local_78 * 0.5) & -(ulong)(local_68 < dVar37)),
                   dVar37 < local_68)) {
                  dVar36 = dVar36 * 1.2;
                }
                if (uVar31 != 0) {
                  pHVar13 = pHVar10->gv_switch;
                  uVar29 = 0;
                  do {
                    if (pHVar13[uVar29] != '\0') {
                      pHVar10->par[uVar29][sVar11] =
                           (pHVar10->sm).g[uVar29] * dVar36 + pHVar10->par[uVar29][sVar11];
                    }
                    uVar29 = uVar29 + 1;
                  } while (uVar31 != uVar29);
                }
                uVar32 = uVar32 + 1;
              } while (uVar32 != 6);
            }
            sVar11 = sVar11 + 1;
          } while (sVar11 < pHVar10->vector_length);
        }
        sVar9 = sVar9 + 1;
      } while (sVar9 < pss->nstream);
    }
    HVar7 = '\x01';
  }
  else {
    HVar7 = '\0';
    HTS_error(1,"HTS_PstreamSet_create: HTS_PStreamSet should be clear.\n");
  }
  return HVar7;
}

Assistant:

HTS_Boolean HTS_PStreamSet_create(HTS_PStreamSet * pss, HTS_SStreamSet * sss, double *msd_threshold, double *gv_weight)
{
   size_t i, j, k, l, m;
   int shift;
   size_t frame, msd_frame, state;

   HTS_PStream *pst;
   HTS_Boolean not_bound;

   if (pss->nstream != 0) {
      HTS_error(1, "HTS_PstreamSet_create: HTS_PStreamSet should be clear.\n");
      return FALSE;
   }

   /* initialize */
   pss->nstream = HTS_SStreamSet_get_nstream(sss);
   pss->pstream = (HTS_PStream *) HTS_calloc(pss->nstream, sizeof(HTS_PStream));
   pss->total_frame = HTS_SStreamSet_get_total_frame(sss);

   /* create */
   for (i = 0; i < pss->nstream; i++) {
      pst = &pss->pstream[i];
      if (HTS_SStreamSet_is_msd(sss, i) == TRUE) {      /* for MSD */
         pst->length = 0;
         for (state = 0; state < HTS_SStreamSet_get_total_state(sss); state++)
            if (HTS_SStreamSet_get_msd(sss, i, state) > msd_threshold[i])
               pst->length += HTS_SStreamSet_get_duration(sss, state);
         pst->msd_flag = (HTS_Boolean *) HTS_calloc(pss->total_frame, sizeof(HTS_Boolean));
         for (state = 0, frame = 0; state < HTS_SStreamSet_get_total_state(sss); state++) {
            if (HTS_SStreamSet_get_msd(sss, i, state) > msd_threshold[i]) {
               for (j = 0; j < HTS_SStreamSet_get_duration(sss, state); j++) {
                  pst->msd_flag[frame] = TRUE;
                  frame++;
               }
            } else {
               for (j = 0; j < HTS_SStreamSet_get_duration(sss, state); j++) {
                  pst->msd_flag[frame] = FALSE;
                  frame++;
               }
            }
         }
      } else {                  /* for non MSD */
         pst->length = pss->total_frame;
         pst->msd_flag = NULL;
      }
      pst->vector_length = HTS_SStreamSet_get_vector_length(sss, i);
      pst->width = HTS_SStreamSet_get_window_max_width(sss, i) * 2 + 1; /* band width of R */
      pst->win_size = HTS_SStreamSet_get_window_size(sss, i);
      if (pst->length > 0) {
         pst->sm.mean = HTS_alloc_matrix(pst->length, pst->vector_length * pst->win_size);
         pst->sm.ivar = HTS_alloc_matrix(pst->length, pst->vector_length * pst->win_size);
         pst->sm.wum = (double *) HTS_calloc(pst->length, sizeof(double));
         pst->sm.wuw = HTS_alloc_matrix(pst->length, pst->width);
         pst->sm.g = (double *) HTS_calloc(pst->length, sizeof(double));
         pst->par = HTS_alloc_matrix(pst->length, pst->vector_length);
      }
      /* copy dynamic window */
      pst->win_l_width = (int *) HTS_calloc(pst->win_size, sizeof(int));
      pst->win_r_width = (int *) HTS_calloc(pst->win_size, sizeof(int));
      pst->win_coefficient = (double **) HTS_calloc(pst->win_size, sizeof(double));
      for (j = 0; j < pst->win_size; j++) {
         pst->win_l_width[j] = HTS_SStreamSet_get_window_left_width(sss, i, j);
         pst->win_r_width[j] = HTS_SStreamSet_get_window_right_width(sss, i, j);
         if (pst->win_l_width[j] + pst->win_r_width[j] == 0)
            pst->win_coefficient[j] = (double *)
                HTS_calloc(-2 * pst->win_l_width[j] + 1, sizeof(double));
         else
            pst->win_coefficient[j] = (double *)
                HTS_calloc(-2 * pst->win_l_width[j], sizeof(double));
         pst->win_coefficient[j] -= pst->win_l_width[j];
         for (shift = pst->win_l_width[j]; shift <= pst->win_r_width[j]; shift++)
            pst->win_coefficient[j][shift] = HTS_SStreamSet_get_window_coefficient(sss, i, j, shift);
      }
      /* copy GV */
      if (HTS_SStreamSet_use_gv(sss, i)) {
         pst->gv_mean = (double *) HTS_calloc(pst->vector_length, sizeof(double));
         pst->gv_vari = (double *) HTS_calloc(pst->vector_length, sizeof(double));
         for (j = 0; j < pst->vector_length; j++) {
            pst->gv_mean[j] = HTS_SStreamSet_get_gv_mean(sss, i, j) * gv_weight[i];
            pst->gv_vari[j] = HTS_SStreamSet_get_gv_vari(sss, i, j);
         }
         pst->gv_switch = (HTS_Boolean *) HTS_calloc(pst->length, sizeof(HTS_Boolean));
         if (HTS_SStreamSet_is_msd(sss, i) == TRUE) {   /* for MSD */
            for (state = 0, frame = 0, msd_frame = 0; state < HTS_SStreamSet_get_total_state(sss); state++)
               for (j = 0; j < HTS_SStreamSet_get_duration(sss, state); j++, frame++)
                  if (pst->msd_flag[frame] == TRUE)
                     pst->gv_switch[msd_frame++] = HTS_SStreamSet_get_gv_switch(sss, i, state);
         } else {               /* for non MSD */
            for (state = 0, frame = 0; state < HTS_SStreamSet_get_total_state(sss); state++)
               for (j = 0; j < HTS_SStreamSet_get_duration(sss, state); j++)
                  pst->gv_switch[frame++] = HTS_SStreamSet_get_gv_switch(sss, i, state);
         }
         for (j = 0, pst->gv_length = 0; j < pst->length; j++)
            if (pst->gv_switch[j])
               pst->gv_length++;
      } else {
         pst->gv_switch = NULL;
         pst->gv_length = 0;
         pst->gv_mean = NULL;
         pst->gv_vari = NULL;
      }
      /* copy pdfs */
      if (HTS_SStreamSet_is_msd(sss, i) == TRUE) {      /* for MSD */
         for (state = 0, frame = 0, msd_frame = 0; state < HTS_SStreamSet_get_total_state(sss); state++) {
            for (j = 0; j < HTS_SStreamSet_get_duration(sss, state); j++) {
               if (pst->msd_flag[frame] == TRUE) {
                  /* check current frame is MSD boundary or not */
                  for (k = 0; k < pst->win_size; k++) {
                     not_bound = TRUE;
                     for (shift = pst->win_l_width[k]; shift <= pst->win_r_width[k]; shift++)
                        if ((int) frame + shift < 0 || (int) pss->total_frame <= (int) frame + shift || pst->msd_flag[frame + shift] != TRUE) {
                           not_bound = FALSE;
                           break;
                        }
                     for (l = 0; l < pst->vector_length; l++) {
                        m = pst->vector_length * k + l;
                        pst->sm.mean[msd_frame][m] = HTS_SStreamSet_get_mean(sss, i, state, m);
                        if (not_bound || k == 0)
                           pst->sm.ivar[msd_frame][m] = HTS_finv(HTS_SStreamSet_get_vari(sss, i, state, m));
                        else
                           pst->sm.ivar[msd_frame][m] = 0.0;
                     }
                  }
                  msd_frame++;
               }
               frame++;
            }
         }
      } else {                  /* for non MSD */
         for (state = 0, frame = 0; state < HTS_SStreamSet_get_total_state(sss); state++) {
            for (j = 0; j < HTS_SStreamSet_get_duration(sss, state); j++) {
               for (k = 0; k < pst->win_size; k++) {
                  not_bound = TRUE;
                  for (shift = pst->win_l_width[k]; shift <= pst->win_r_width[k]; shift++)
                     if ((int) frame + shift < 0 || (int) pss->total_frame <= (int) frame + shift) {
                        not_bound = FALSE;
                        break;
                     }
                  for (l = 0; l < pst->vector_length; l++) {
                     m = pst->vector_length * k + l;
                     pst->sm.mean[frame][m] = HTS_SStreamSet_get_mean(sss, i, state, m);
                     if (not_bound || k == 0)
                        pst->sm.ivar[frame][m] = HTS_finv(HTS_SStreamSet_get_vari(sss, i, state, m));
                     else
                        pst->sm.ivar[frame][m] = 0.0;
                  }
               }
               frame++;
            }
         }
      }
      /* parameter generation */
      HTS_PStream_mlpg(pst);
   }

   return TRUE;
}